

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

path * __thiscall boost::filesystem::path::relative_path(path *__return_storage_ptr__,path *this)

{
  iterator itr;
  allocator<char> local_49;
  iterator local_48;
  
  begin(&local_48,this);
  while ((local_48.m_pos != (this->m_pathname)._M_string_length &&
         (*local_48.m_element.m_pathname._M_dataplus._M_p == '/'))) {
    m_path_iterator_increment(&local_48);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(this->m_pathname)._M_dataplus._M_p + local_48.m_pos,
             &local_49);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_element.m_pathname._M_dataplus._M_p != &local_48.m_element.m_pathname.field_2) {
    operator_delete(local_48.m_element.m_pathname._M_dataplus._M_p,
                    local_48.m_element.m_pathname.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

path path::relative_path() const
  {
    iterator itr(begin());

    for (; itr.m_pos != m_pathname.size()
      && (is_separator(itr.m_element.m_pathname[0])
#     ifdef BOOST_WINDOWS_API
      || itr.m_element.m_pathname[itr.m_element.m_pathname.size()-1] == colon
#     endif
    ); ++itr) {}

    return path(m_pathname.c_str() + itr.m_pos);
  }